

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

ssize_t __thiscall
fmt::v6::internal::arg_formatter_base<fmt::v6::buffer_range<char>,_fmt::v6::internal::error_handler>
::write(arg_formatter_base<fmt::v6::buffer_range<char>,_fmt::v6::internal::error_handler> *this,
       int __fd,void *__buf,size_t __n)

{
  ssize_t sVar1;
  ssize_t extraout_RAX;
  char *pcVar2;
  basic_string_view<char> s;
  
  pcVar2 = "false";
  if (__fd != 0) {
    pcVar2 = "true";
  }
  s.size_ = (void *)((ulong)(uint)__fd ^ 5);
  if (this->specs_ != (format_specs *)0x0) {
    s.data_ = pcVar2;
    basic_writer<fmt::v6::buffer_range<char>_>::write<char>(&this->writer_,s,this->specs_);
    return extraout_RAX;
  }
  sVar1 = basic_writer<fmt::v6::buffer_range<char>_>::write(&this->writer_,(int)pcVar2,s.size_,0);
  return sVar1;
}

Assistant:

void write(bool value) {
    string_view sv(value ? "true" : "false");
    specs_ ? writer_.write(sv, *specs_) : writer_.write(sv);
  }